

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceMemoryBase<Diligent::EngineVkImplTraits>::DeviceMemoryBase
          (DeviceMemoryBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,DeviceMemoryCreateInfo *MemCI)

{
  Uint64 *Args_1;
  ulong uVar1;
  RenderDeviceVkImpl *pRVar2;
  ulong uVar3;
  string msg;
  _Alloc_hider in_stack_ffffffffffffffc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  size_t local_20;
  
  DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                     ,pRefCounters,pDevice,&MemCI->Desc,false);
  (this->
  super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
  ).super_ObjectBase<Diligent::IDeviceMemoryVk>.super_RefCountedObject<Diligent::IDeviceMemoryVk>.
  super_IDeviceMemoryVk.super_IDeviceMemory.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_00934e70;
  if (MemCI->InitialSize == 0) {
    LogError<true,char[53]>
              (false,"DeviceMemoryBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceMemoryBase.hpp"
               ,0x44,(char (*) [53])"DeviceMemoryCreateInfo::InitialSize must not be zero");
  }
  pRVar2 = DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                      );
  ValidateDeviceMemoryDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
              ).m_Desc,(IRenderDevice *)pRVar2);
  pRVar2 = DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                      );
  uVar1 = (pRVar2->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).m_CmdQueueCount;
  uVar3 = ~(-1L << ((byte)uVar1 & 0x3f));
  if (0x3f < uVar1) {
    uVar3 = 0xffffffffffffffff;
  }
  Args_1 = &(this->
            super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
            ).m_Desc.ImmediateContextMask;
  if (((this->
       super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
       ).m_Desc.ImmediateContextMask & uVar3) == 0) {
    pRVar2 = DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                        );
    local_20 = (pRVar2->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).m_CmdQueueCount;
    FormatString<char[42],std::ios_base&(std::ios_base&),unsigned_long,char[24],unsigned_long,char[35]>
              ((string *)&stack0xffffffffffffffc0,
               (Diligent *)"No bits in the immediate context mask (0x",(char (*) [42])std::hex,
               (_func_ios_base_ptr_ios_base_ptr *)Args_1,(unsigned_long *)") correspond to one of ",
               (char (*) [24])&local_20,(unsigned_long *)" available software command queues",
               (char (*) [35])in_stack_ffffffffffffffc0._M_p);
    DebugAssertionFailed
              (in_stack_ffffffffffffffc0._M_p,"DeviceMemoryBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceMemoryBase.hpp"
               ,0x4b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc0._M_p != &local_30) {
      operator_delete(in_stack_ffffffffffffffc0._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  *Args_1 = *Args_1 & uVar3;
  return;
}

Assistant:

DeviceMemoryBase(IReferenceCounters*           pRefCounters,
                     RenderDeviceImplType*         pDevice,
                     const DeviceMemoryCreateInfo& MemCI) :
        TDeviceObjectBase{pRefCounters, pDevice, MemCI.Desc, false}
    {
        if (MemCI.InitialSize == 0)
            LOG_ERROR_AND_THROW("DeviceMemoryCreateInfo::InitialSize must not be zero");

        ValidateDeviceMemoryDesc(this->m_Desc, this->GetDevice());

        Uint64 DeviceQueuesMask = this->GetDevice()->GetCommandQueueMask();
        DEV_CHECK_ERR((this->m_Desc.ImmediateContextMask & DeviceQueuesMask) != 0,
                      "No bits in the immediate context mask (0x", std::hex, this->m_Desc.ImmediateContextMask,
                      ") correspond to one of ", this->GetDevice()->GetCommandQueueCount(), " available software command queues");
        this->m_Desc.ImmediateContextMask &= DeviceQueuesMask;
    }